

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::HardSwish_x86_avx::forward_inplace(HardSwish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  void *pvVar6;
  long lVar7;
  int iVar8;
  undefined1 (*pauVar9) [32];
  int _c;
  int iVar10;
  int iVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  Mat local_78;
  
  iVar11 = bottom_top_blob->c;
  iVar10 = bottom_top_blob->h * bottom_top_blob->w;
  _c = 0;
  if (bottom_top_blob->elempack == 8) {
    if (iVar10 < 1) {
      iVar10 = _c;
    }
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    for (; _c != iVar11; _c = _c + 1) {
      ncnn::Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar9 = (undefined1 (*) [32])local_78.data;
      ncnn::Mat::~Mat(&local_78);
      auVar19._8_4_ = 0x3f800000;
      auVar19._0_8_ = 0x3f8000003f800000;
      auVar19._12_4_ = 0x3f800000;
      auVar19._16_4_ = 0x3f800000;
      auVar19._20_4_ = 0x3f800000;
      auVar19._24_4_ = 0x3f800000;
      auVar19._28_4_ = 0x3f800000;
      pp_Var2 = this->_vptr_HardSwish_x86_avx;
      iVar8 = iVar10;
      while (bVar12 = iVar8 != 0, iVar8 = iVar8 + -1, bVar12) {
        fVar1 = *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
        fVar16 = *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
        auVar20 = *pauVar9;
        auVar14._0_4_ = fVar16 * auVar20._0_4_ + fVar1;
        auVar14._4_4_ = fVar16 * auVar20._4_4_ + fVar1;
        auVar14._8_4_ = fVar16 * auVar20._8_4_ + fVar1;
        auVar14._12_4_ = fVar16 * auVar20._12_4_ + fVar1;
        auVar14._16_4_ = fVar16 * auVar20._16_4_ + fVar1;
        auVar14._20_4_ = fVar16 * auVar20._20_4_ + fVar1;
        auVar14._24_4_ = fVar16 * auVar20._24_4_ + fVar1;
        auVar14._28_4_ = fVar16 + fVar1;
        auVar14 = vmaxps_avx(auVar14,ZEXT1632(ZEXT816(0) << 0x40));
        auVar14 = vminps_avx(auVar14,auVar19);
        auVar4._4_4_ = auVar14._4_4_ * auVar20._4_4_;
        auVar4._0_4_ = auVar14._0_4_ * auVar20._0_4_;
        auVar4._8_4_ = auVar14._8_4_ * auVar20._8_4_;
        auVar4._12_4_ = auVar14._12_4_ * auVar20._12_4_;
        auVar4._16_4_ = auVar14._16_4_ * auVar20._16_4_;
        auVar4._20_4_ = auVar14._20_4_ * auVar20._20_4_;
        auVar4._24_4_ = auVar14._24_4_ * auVar20._24_4_;
        auVar4._28_4_ = auVar14._28_4_;
        *pauVar9 = auVar4;
        pauVar9 = pauVar9 + 1;
      }
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (iVar10 < 1) {
      iVar10 = _c;
    }
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    for (; _c != iVar11; _c = _c + 1) {
      ncnn::Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar9 = (undefined1 (*) [32])local_78.data;
      ncnn::Mat::~Mat(&local_78);
      auVar18._8_4_ = 0x3f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      auVar18._12_4_ = 0x3f800000;
      pp_Var2 = this->_vptr_HardSwish_x86_avx;
      iVar8 = iVar10;
      while (bVar12 = iVar8 != 0, iVar8 = iVar8 + -1, bVar12) {
        fVar1 = *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
        fVar16 = *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
        auVar17._0_4_ = fVar16 * *(float *)*pauVar9 + fVar1;
        auVar17._4_4_ = fVar16 * *(float *)(*pauVar9 + 4) + fVar1;
        auVar17._8_4_ = fVar16 * *(float *)(*pauVar9 + 8) + fVar1;
        auVar17._12_4_ = fVar16 * *(float *)(*pauVar9 + 0xc) + fVar1;
        auVar17 = vmaxps_avx(auVar17,ZEXT816(0) << 0x40);
        auVar17 = vminps_avx(auVar17,auVar18);
        auVar13._0_4_ = auVar17._0_4_ * *(float *)*pauVar9;
        auVar13._4_4_ = auVar17._4_4_ * *(float *)(*pauVar9 + 4);
        auVar13._8_4_ = auVar17._8_4_ * *(float *)(*pauVar9 + 8);
        auVar13._12_4_ = auVar17._12_4_ * *(float *)(*pauVar9 + 0xc);
        *(undefined1 (*) [16])*pauVar9 = auVar13;
        pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
      }
    }
  }
  else {
    if (iVar11 < 1) {
      iVar11 = _c;
    }
    for (; _c != iVar11; _c = _c + 1) {
      ncnn::Mat::channel(&local_78,bottom_top_blob,_c);
      pvVar6 = local_78.data;
      ncnn::Mat::~Mat(&local_78);
      auVar20._8_4_ = 0x3f800000;
      auVar20._0_8_ = 0x3f8000003f800000;
      auVar20._12_4_ = 0x3f800000;
      auVar20._16_4_ = 0x3f800000;
      auVar20._20_4_ = 0x3f800000;
      auVar20._24_4_ = 0x3f800000;
      auVar20._28_4_ = 0x3f800000;
      pp_Var2 = this->_vptr_HardSwish_x86_avx;
      lVar7 = 0;
      pauVar9 = (undefined1 (*) [32])pvVar6;
      for (iVar8 = 0; iVar8 + 7 < iVar10; iVar8 = iVar8 + 8) {
        fVar1 = *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
        auVar19 = *pauVar9;
        fVar16 = *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
        auVar15._0_4_ = fVar16 * auVar19._0_4_ + fVar1;
        auVar15._4_4_ = fVar16 * auVar19._4_4_ + fVar1;
        auVar15._8_4_ = fVar16 * auVar19._8_4_ + fVar1;
        auVar15._12_4_ = fVar16 * auVar19._12_4_ + fVar1;
        auVar15._16_4_ = fVar16 * auVar19._16_4_ + fVar1;
        auVar15._20_4_ = fVar16 * auVar19._20_4_ + fVar1;
        auVar15._24_4_ = fVar16 * auVar19._24_4_ + fVar1;
        auVar15._28_4_ = fVar16 + fVar1;
        auVar14 = vmaxps_avx(auVar15,ZEXT1632(ZEXT816(0) << 0x40));
        auVar14 = vminps_avx(auVar14,auVar20);
        auVar5._4_4_ = auVar14._4_4_ * auVar19._4_4_;
        auVar5._0_4_ = auVar14._0_4_ * auVar19._0_4_;
        auVar5._8_4_ = auVar14._8_4_ * auVar19._8_4_;
        auVar5._12_4_ = auVar14._12_4_ * auVar19._12_4_;
        auVar5._16_4_ = auVar14._16_4_ * auVar19._16_4_;
        auVar5._20_4_ = auVar14._20_4_ * auVar19._20_4_;
        auVar5._24_4_ = auVar14._24_4_ * auVar19._24_4_;
        auVar5._28_4_ = auVar14._28_4_;
        *pauVar9 = auVar5;
        pauVar9 = pauVar9 + 1;
        lVar7 = lVar7 + 8;
      }
      pp_Var2 = this->_vptr_HardSwish_x86_avx;
      for (; (int)lVar7 < iVar10; lVar7 = lVar7 + 1) {
        fVar1 = *(float *)((undefined1 *)pvVar6 + lVar7 * 4);
        p_Var3 = pp_Var2[-3];
        fVar16 = 0.0;
        if (fVar1 < *(float *)(&this->field_0xd8 + (long)p_Var3)) {
LAB_002c3b4f:
          *(float *)((undefined1 *)pvVar6 + lVar7 * 4) = fVar16;
        }
        else if (fVar1 <= *(float *)(&this->field_0xdc + (long)p_Var3)) {
          fVar16 = (fVar1 * *(float *)(&this->field_0xd0 + (long)p_Var3) +
                   *(float *)(&this->field_0xd4 + (long)p_Var3)) * fVar1;
          goto LAB_002c3b4f;
        }
      }
    }
  }
  return 0;
}

Assistant:

int HardSwish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _zero = _mm256_set1_ps(0.f);
            __m256 _one = _mm256_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ans = _mm256_set1_ps(beta);
                _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
                _ans = _mm256_max_ps(_ans, _zero);
                _ans = _mm256_min_ps(_ans, _one);
                _ans = _mm256_mul_ps(_ans, _p);
                _mm256_storeu_ps(ptr, _ans);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _zero = _mm_set1_ps(0.f);
            __m128 _one = _mm_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _ans = _mm_set1_ps(beta);
                _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
                _ans = _mm_max_ps(_ans, _zero);
                _ans = _mm_min_ps(_ans, _one);
                _ans = _mm_mul_ps(_ans, _p);
                _mm_storeu_ps(ptr, _ans);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __AVX__
        __m256 _zero = _mm256_set1_ps(0.f);
        __m256 _one = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero);
            _ans = _mm256_min_ps(_ans, _one);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);

            ptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ++ptr;
        }
    }

    return 0;
}